

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O0

MatchInfoCollection * __thiscall
icu_63::TZGNCore::findTimeZoneNames
          (TZGNCore *this,UnicodeString *text,int32_t start,uint32_t types,UErrorCode *status)

{
  int iVar1;
  undefined4 extraout_var;
  uint local_34;
  uint32_t nameTypes;
  UErrorCode *status_local;
  uint32_t types_local;
  int32_t start_local;
  UnicodeString *text_local;
  TZGNCore *this_local;
  
  local_34 = 0;
  if ((types & 2) != 0) {
    local_34 = 3;
  }
  if ((types & 4) != 0) {
    local_34 = local_34 | 0x18;
  }
  if (types == 0) {
    this_local = (TZGNCore *)0x0;
  }
  else {
    iVar1 = (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[0xf])
                      (this->fTimeZoneNames,text,(ulong)(uint)start,(ulong)local_34,status);
    this_local = (TZGNCore *)CONCAT44(extraout_var,iVar1);
  }
  return (MatchInfoCollection *)this_local;
}

Assistant:

TimeZoneNames::MatchInfoCollection*
TZGNCore::findTimeZoneNames(const UnicodeString& text, int32_t start, uint32_t types, UErrorCode& status) const {
    // Check if the target name typs is really in the TimeZoneNames
    uint32_t nameTypes = 0;
    if (types & UTZGNM_LONG) {
        nameTypes |= (UTZNM_LONG_GENERIC | UTZNM_LONG_STANDARD);
    }
    if (types & UTZGNM_SHORT) {
        nameTypes |= (UTZNM_SHORT_GENERIC | UTZNM_SHORT_STANDARD);
    }

    if (types) {
        // Find matches in the TimeZoneNames
        return fTimeZoneNames->find(text, start, nameTypes, status);
    }

    return NULL;
}